

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

BIO * BIO_new_file(char *filename,char *mode)

{
  FILE *stream;
  int *piVar1;
  FILE *file;
  BIO *ret;
  char *mode_local;
  char *filename_local;
  
  stream = fopen64(filename,mode);
  if (stream == (FILE *)0x0) {
    ERR_put_error(2,0,0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                  ,0x44);
    ERR_add_error_data(5,"fopen(\'",filename,"\',\'",mode,"\')");
    piVar1 = __errno_location();
    if (*piVar1 == 2) {
      ERR_put_error(0x11,0,0x6e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                    ,0x48);
    }
    else {
      ERR_put_error(0x11,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                    ,0x4a);
    }
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)BIO_new_fp(stream,1);
    if ((BIO *)filename_local == (BIO *)0x0) {
      fclose(stream);
      filename_local = (char *)0x0;
    }
  }
  return (BIO *)filename_local;
}

Assistant:

BIO *BIO_new_file(const char *filename, const char *mode) {
  BIO *ret;
  FILE *file;

  file = fopen_if_available(filename, mode);
  if (file == NULL) {
    OPENSSL_PUT_SYSTEM_ERROR();

    ERR_add_error_data(5, "fopen('", filename, "','", mode, "')");
    if (errno == ENOENT) {
      OPENSSL_PUT_ERROR(BIO, BIO_R_NO_SUCH_FILE);
    } else {
      OPENSSL_PUT_ERROR(BIO, BIO_R_SYS_LIB);
    }
    return NULL;
  }

  ret = BIO_new_fp(file, BIO_CLOSE);
  if (ret == NULL) {
    fclose(file);
    return NULL;
  }

  return ret;
}